

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTest.cpp
# Opt level: O2

bool __thiscall DOMTest::testComment(DOMTest *this,DOMDocument *document)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  long *plVar4;
  DOMNode *pDVar5;
  XMLCh *pXVar6;
  wchar16 *pwVar7;
  wchar16 *pwVar8;
  long lVar9;
  DOMDocument *pDVar10;
  XMLCh *pXVar11;
  XMLCh *pXVar12;
  DOMDocument *pDVar13;
  DOMNode *pDVar14;
  DOMNode *pDVar15;
  
  xercesc_4_0::XMLString::transcode
            ("dBodyLevel31",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar4 = (long *)(**(code **)(*(long *)document + 0x68))(document);
  plVar4 = (long *)(**(code **)(*plVar4 + 0x158))(plVar4,tempStr);
  plVar4 = (long *)(**(code **)(*plVar4 + 0x10))(plVar4,0);
  pDVar5 = (DOMNode *)(**(code **)(*plVar4 + 0x38))(plVar4);
  pXVar6 = (XMLCh *)(**(code **)(*(long *)pDVar5 + 0x68))(pDVar5,1);
  pwVar7 = (wchar16 *)(**(code **)(*(long *)pDVar5 + 0x10))(pDVar5);
  pwVar8 = (wchar16 *)(**(code **)(*(long *)pXVar6 + 0x10))(pXVar6);
  iVar3 = xercesc_4_0::XMLString::compareString(pwVar7,pwVar8);
  if (((iVar3 == 0) && (lVar9 = (**(code **)(*(long *)pDVar5 + 0x18))(pDVar5), lVar9 != 0)) &&
     (lVar9 = (**(code **)(*(long *)pXVar6 + 0x18))(pXVar6), lVar9 != 0)) {
    pwVar7 = (wchar16 *)(**(code **)(*(long *)pDVar5 + 0x18))(pDVar5);
    pwVar8 = (wchar16 *)(**(code **)(*(long *)pXVar6 + 0x18))(pXVar6);
    iVar3 = xercesc_4_0::XMLString::compareString(pwVar7,pwVar8);
    bVar1 = true;
    if (iVar3 == 0) goto LAB_0010d06e;
  }
  else {
    lVar9 = (**(code **)(*(long *)pDVar5 + 0x18))(pDVar5);
    if (lVar9 == 0) {
      lVar9 = (**(code **)(*(long *)pXVar6 + 0x18))(pXVar6);
      bVar1 = true;
      if (lVar9 == 0) goto LAB_0010d06e;
    }
  }
  fwrite("\'cloneNode\' did not clone the DOMComment* node correctly\n",0x39,1,_stderr);
  bVar1 = false;
LAB_0010d06e:
  xercesc_4_0::XMLString::transcode
            ("first",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::transcode
            ("document",tempStr2,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  (**(code **)(*(long *)pDVar5 + 0xe8))(pDVar5,tempStr2,document,0);
  pDVar10 = (DOMDocument *)(**(code **)(*(long *)pDVar5 + 0xf0))(pDVar5,tempStr2);
  if (pDVar10 != document) {
    bVar1 = false;
    fprintf(_stderr,"\'set/getUserData\' in line %i does not work\n",0x7d2);
  }
  (**(code **)(*(long *)pDVar5 + 0xe8))(pDVar5,tempStr,pXVar6,0);
  pXVar11 = (XMLCh *)(**(code **)(*(long *)pDVar5 + 0xf0))(pDVar5,tempStr);
  if (pXVar6 != pXVar11) {
    bVar1 = false;
    fprintf(_stderr,"\'set/getUserData\' in line %i does not work\n",0x7d9);
  }
  pXVar11 = (XMLCh *)(**(code **)(*(long *)pDVar5 + 0xe8))(pDVar5,tempStr,tempStr2,0);
  pXVar12 = (XMLCh *)(**(code **)(*(long *)pDVar5 + 0xf0))(pDVar5,tempStr);
  if (pXVar12 != tempStr2) {
    bVar1 = false;
    fprintf(_stderr,"overwrite userdata with same key in line %i does not work\n",0x7e1);
  }
  if (pXVar6 != pXVar11) {
    bVar1 = false;
    fprintf(_stderr,"overwrite userdata with same key in line %i does not work\n",0x7e5);
  }
  if (pXVar6 == pXVar12) {
    bVar1 = false;
    fprintf(_stderr,"overwrite userdata with same key in line %i does not work\n",0x7e9);
  }
  xercesc_4_0::XMLString::transcode
            ("not-exist",tempStr3,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  lVar9 = (**(code **)(*(long *)pDVar5 + 0xf0))(pDVar5,tempStr3);
  if (lVar9 != 0) {
    bVar1 = false;
    fprintf(_stderr,"get non-exist user data in line %i does not work\n",0x7f1);
  }
  lVar9 = (**(code **)(*(long *)pXVar6 + 0xf0))(pXVar6,tempStr);
  if (lVar9 != 0) {
    bVar1 = false;
    fprintf(_stderr,"get non-exist user data in line %i does not work\n",0x7f7);
  }
  pXVar11 = (XMLCh *)(**(code **)(*(long *)pDVar5 + 0xe8))(pDVar5,tempStr,0,0);
  lVar9 = (**(code **)(*(long *)pDVar5 + 0xf0))(pDVar5,tempStr);
  if (pXVar11 != tempStr2) {
    bVar1 = false;
    fprintf(_stderr,"overwrite userdata with same key in line %i does not work\n",0x7ff);
  }
  if (lVar9 != 0) {
    bVar1 = false;
    fprintf(_stderr,"overwrite userdata with same key in line %i does not work\n",0x803);
  }
  pDVar13 = (DOMDocument *)(**(code **)(*(long *)pDVar5 + 0xe8))(pDVar5,tempStr2,0,0);
  lVar9 = (**(code **)(*(long *)pDVar5 + 0xf0))(pDVar5,tempStr2);
  if (pDVar10 != pDVar13) {
    bVar1 = false;
    fprintf(_stderr,"overwrite userdata with same key in line %i does not work\n",0x80a);
  }
  if (lVar9 != 0) {
    bVar1 = false;
    fprintf(_stderr,"overwrite userdata with same key in line %i does not work\n",0x80e);
  }
  lVar9 = (**(code **)(*(long *)pDVar5 + 0xf0))(pDVar5,tempStr);
  if (lVar9 != 0) {
    bVar1 = false;
    fprintf(_stderr,"get non-exist user data in line %i does not work\n",0x814);
  }
  lVar9 = (**(code **)(*(long *)pDVar5 + 0xf0))(pDVar5,tempStr2);
  if (lVar9 != 0) {
    bVar1 = false;
    fprintf(_stderr,"get non-exist user data in line %i does not work\n",0x818);
  }
  (**(code **)(*(long *)pDVar5 + 0xe8))(pDVar5,tempStr2,document,&userhandler);
  pDVar14 = (DOMNode *)(**(code **)(*(long *)pDVar5 + 0x68))(pDVar5,1);
  if (userhandler.currentType != NODE_CLONED) {
    bVar1 = false;
    fprintf(_stderr,"DOMUserDataHandler::handler\'s operationType does not work in line %i\n",0x820)
    ;
  }
  iVar3 = xercesc_4_0::XMLString::compareString(userhandler.currentKey,tempStr2);
  if (iVar3 != 0) {
    bVar1 = false;
    fprintf(_stderr,"DOMUserDataHandler::handler\'s key does not work in line %i\n",0x820);
  }
  if ((DOMDocument *)userhandler.currentData != document) {
    bVar1 = false;
    fprintf(_stderr,"DOMUserDataHandler::handler\'s data does not work in line %i\n",0x820);
  }
  if (userhandler.currentSrc != pDVar5) {
    bVar1 = false;
    fprintf(_stderr,"DOMUserDataHandler::handler\'s src does not work in line %i\n",0x820);
  }
  if (userhandler.currentDst != pDVar14) {
    bVar1 = false;
    fprintf(_stderr,"DOMUserDataHandler::handler\'s dst does not work in line %i\n",0x820);
  }
  (**(code **)(*(long *)(document + 0x18) + 0xe8))(document + 0x18,tempStr2,document,&userhandler);
  pDVar15 = (DOMNode *)(**(code **)(*(long *)document + 0x78))(document,pDVar5,1);
  if (userhandler.currentType != NODE_IMPORTED) {
    bVar1 = false;
    fprintf(_stderr,"DOMUserDataHandler::handler\'s operationType does not work in line %i\n",0x825)
    ;
  }
  iVar3 = xercesc_4_0::XMLString::compareString(userhandler.currentKey,tempStr2);
  if (iVar3 != 0) {
    bVar1 = false;
    fprintf(_stderr,"DOMUserDataHandler::handler\'s key does not work in line %i\n",0x825);
  }
  if ((DOMDocument *)userhandler.currentData != document) {
    bVar1 = false;
    fprintf(_stderr,"DOMUserDataHandler::handler\'s data does not work in line %i\n",0x825);
  }
  if (userhandler.currentSrc != pDVar5) {
    bVar1 = false;
    fprintf(_stderr,"DOMUserDataHandler::handler\'s src does not work in line %i\n",0x825);
  }
  if (userhandler.currentDst != pDVar15) {
    bVar1 = false;
    fprintf(_stderr,"DOMUserDataHandler::handler\'s dst does not work in line %i\n",0x825);
  }
  (**(code **)(*(long *)pDVar15 + 0xe8))(pDVar15,tempStr2,pDVar5,&userhandler);
  (**(code **)(*(long *)pDVar15 + 0x138))(pDVar15);
  if (userhandler.currentType != NODE_DELETED) {
    bVar1 = false;
    fprintf(_stderr,"DOMUserDataHandler::handler\'s operationType does not work in line %i\n",0x82a)
    ;
  }
  iVar3 = xercesc_4_0::XMLString::compareString(userhandler.currentKey,tempStr2);
  if (iVar3 != 0) {
    bVar1 = false;
    fprintf(_stderr,"DOMUserDataHandler::handler\'s key does not work in line %i\n",0x82a);
  }
  if ((DOMNode *)userhandler.currentData != pDVar5) {
    bVar1 = false;
    fprintf(_stderr,"DOMUserDataHandler::handler\'s data does not work in line %i\n",0x82a);
  }
  if (userhandler.currentSrc != (DOMNode *)0x0) {
    bVar1 = false;
    fprintf(_stderr,"DOMUserDataHandler::handler\'s src does not work in line %i\n",0x82a);
  }
  if (userhandler.currentDst != (DOMNode *)0x0) {
    bVar1 = false;
    fprintf(_stderr,"DOMUserDataHandler::handler\'s dst does not work in line %i\n",0x82a);
  }
  cVar2 = (**(code **)(*(long *)pDVar5 + 0xd8))(pDVar5,pDVar5);
  if (cVar2 == '\0') {
    bVar1 = false;
    fprintf(_stderr,"isSameNode failed in line %i\n",0x82e);
  }
  cVar2 = (**(code **)(*(long *)pDVar5 + 0xd8))(pDVar5,pXVar6);
  if (cVar2 != '\0') {
    bVar1 = false;
    fprintf(_stderr,"isSameNode failed in line %i\n",0x832);
  }
  cVar2 = (**(code **)(*(long *)pDVar5 + 0xe0))(pDVar5,pDVar14);
  if (cVar2 == '\0') {
    bVar1 = false;
    fprintf(_stderr,"isEqualNode failed in line %i\n",0x838);
  }
  cVar2 = (**(code **)(*(long *)pDVar5 + 0xe0))(pDVar5,pDVar5);
  if (cVar2 == '\0') {
    bVar1 = false;
    fprintf(_stderr,"isEqualNode failed in line %i\n",0x83d);
  }
  cVar2 = (**(code **)(*(long *)pDVar5 + 0xe0))(pDVar5,document + 0x18);
  if (cVar2 != '\0') {
    bVar1 = false;
    fprintf(_stderr,"isEqualNode failed in line %i\n",0x841);
  }
  (**(code **)(*(long *)document + 0xf0))(document,pDVar5,0,tempStr2);
  fprintf(_stderr,"Exceptions Test # %d: no Exception thrown->\n",0xce);
  if (!bVar1) {
    puts(
        "\n*****The DOMComment* method calls listed above failed, all others worked correctly.*****"
        );
  }
  return bVar1;
}

Assistant:

bool DOMTest::testComment(DOMDocument* document)
{
    DOMNode* node;
    DOMNode* node2;
    bool T = true;
    bool OK = true;
// For debugging*****   printf("\n          testComment's outputs:\n");
    XMLString::transcode("dBodyLevel31", tempStr, 3999);
    node = document->getDocumentElement()->getElementsByTagName(tempStr)->item(0)->getFirstChild(); // node gets textNode11
    node2 = node->cloneNode(T);
    // Check nodes for equality, both their name and value or lack thereof
    if (!(!XMLString::compareString(node->getNodeName(), node2->getNodeName()) &&        // Compares node names for equality
          (node->getNodeValue() != 0 && node2->getNodeValue() != 0)     // Checks to make sure each node has a value node
        ? !XMLString::compareString(node->getNodeValue(), node2->getNodeValue())         // If both have value nodes test those value nodes for equality
        : (node->getNodeValue() == 0 && node2->getNodeValue() == 0)))   // If one node doesn't have a value node make sure both don't
    {
        fprintf(stderr, "'cloneNode' did not clone the DOMComment* node correctly\n");
        OK = false;
    }
    // Deep clone test comparison is in testNode & testDocument

    // Test the user data
    // Test simple set and get
    DOMComment* userTest = (DOMComment*) node;
    DOMComment*  userFirst = (DOMComment*) node2;
    XMLCh* userSecond = tempStr2;
    XMLString::transcode("first", tempStr, 3999);

    XMLString::transcode("document", tempStr2, 3999);
    userTest->setUserData(tempStr2, (void*) document, 0);
    void* mydocument = userTest->getUserData(tempStr2);
    if (document != mydocument) {
        fprintf(stderr, "'set/getUserData' in line %i does not work\n", __LINE__);
        OK = false;
    }

    userTest->setUserData(tempStr, (void*) userFirst, 0);
    void* myFirst = userTest->getUserData(tempStr);
    if (userFirst != myFirst) {
        fprintf(stderr, "'set/getUserData' in line %i does not work\n", __LINE__);
        OK = false;
    }

    // Test overwrite
    void* myFirst2 = userTest->setUserData(tempStr, (void*) userSecond, 0);
    void* mySecond = userTest->getUserData(tempStr);
    if (userSecond != mySecond) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }
    if (userFirst != myFirst2) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }
    if (userFirst == mySecond) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }

    // Test null
    // test non-exist key
    XMLString::transcode("not-exist", tempStr3, 3999);
    if (userTest->getUserData(tempStr3)) {
        fprintf(stderr, "get non-exist user data in line %i does not work\n", __LINE__);
        OK = false;
    }

    // use a node that does not have user data set before
    if (userFirst->getUserData(tempStr)) {
        fprintf(stderr, "get non-exist user data in line %i does not work\n", __LINE__);
        OK = false;
    }

    // Test reset
    void* mySecond2 = userTest->setUserData(tempStr, (void*) 0, 0);
    void* myNull = userTest->getUserData(tempStr);
    if (userSecond != mySecond2) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }
    if (myNull) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }

    void* mydocument2 = userTest->setUserData(tempStr2, (void*) 0, 0);
    void* myNull2 = userTest->getUserData(tempStr2);
    if (mydocument != mydocument2) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }
    if (myNull2) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }

    //the userTest user data table should be null now
    if (userTest->getUserData(tempStr)) {
        fprintf(stderr, "get non-exist user data in line %i does not work\n", __LINE__);
        OK = false;
    }
    if (userTest->getUserData(tempStr2)) {
        fprintf(stderr, "get non-exist user data in line %i does not work\n", __LINE__);
        OK = false;
    }

    // Test DOMUserDataHandler
    // test clone
    userTest->setUserData(tempStr2, (void*) document, &userhandler);
    DOMNode* mycloned = userTest->cloneNode(true);
    USERDATAHANDLERTEST(userhandler, DOMUserDataHandler::NODE_CLONED, tempStr2, document, userTest, mycloned, __LINE__);

    // test import
    document->setUserData(tempStr2, (void*) document, &userhandler);
    DOMNode* myimport = document->importNode(userTest,true);
    USERDATAHANDLERTEST(userhandler, DOMUserDataHandler::NODE_IMPORTED, tempStr2, document, userTest, myimport, __LINE__);

    // test delete
    myimport->setUserData(tempStr2, (void*) userTest, &userhandler);
    myimport->release();
    USERDATAHANDLERTEST(userhandler, DOMUserDataHandler::NODE_DELETED, tempStr2, userTest, 0, 0, __LINE__);

    // Test isSameNode
    if (!userTest->isSameNode(userTest)) {
        fprintf(stderr, "isSameNode failed in line %i\n", __LINE__);
        OK = false;
    }
    if (userTest->isSameNode(userFirst)) {
        fprintf(stderr, "isSameNode failed in line %i\n", __LINE__);
        OK = false;
    }

    // Test isEqualNode
    if (!userTest->isEqualNode(mycloned)) {
        fprintf(stderr, "isEqualNode failed in line %i\n", __LINE__);
        OK = false;
    }

    if (!userTest->isEqualNode(userTest)) {
        fprintf(stderr, "isEqualNode failed in line %i\n", __LINE__);
        OK = false;
    }
    if (userTest->isEqualNode(document)) {
        fprintf(stderr, "isEqualNode failed in line %i\n", __LINE__);
        OK = false;
    }

    // Test rename, should throw exception
    EXCEPTIONSTEST(document->renameNode(userTest, 0, tempStr2), DOMException::NOT_SUPPORTED_ERR, OK, 206 );

    if (!OK)
        printf("\n*****The DOMComment* method calls listed above failed, all others worked correctly.*****\n");
    return OK;
}